

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall Fossilize::ConcurrentDatabase::setup_bucket(ConcurrentDatabase *this)

{
  string *__lhs;
  bool bVar1;
  int iVar2;
  __mode_t __mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  __lhs = &this->base_path;
  std::__cxx11::string::append((char *)__lhs);
  __mode = (int)this + 0x30;
  std::__cxx11::string::append((string *)__lhs);
  iVar2 = Path::mkdir((char *)__lhs,__mode);
  if (SUB41(iVar2,0) == false) {
    fprintf(_stderr,"Fossilize ERROR: Failed to create directory %s.\n",(__lhs->_M_dataplus)._M_p);
  }
  else {
    std::__cxx11::string::append((char *)__lhs);
    std::operator+(&bStack_48,__lhs,"TOUCH");
    bVar1 = Path::touch(&bStack_48);
    std::__cxx11::string::_M_dispose();
    if (!bVar1) {
      fprintf(_stderr,"Fossilize WARN: Failed to touch last access in %s.\n",
              (__lhs->_M_dataplus)._M_p);
    }
    std::operator+(&bStack_48,"/",&this->bucket_basename);
    std::__cxx11::string::append((string *)__lhs);
    std::__cxx11::string::_M_dispose();
    if ((this->readonly_interface)._M_t.
        super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
        .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl !=
        (DatabaseInterface *)0x0) {
      std::operator+(&bStack_48,__lhs,".foz");
      std::__cxx11::string::operator=
                ((string *)
                 ((this->readonly_interface)._M_t.
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl + 2),
                 (string *)&bStack_48);
      std::__cxx11::string::_M_dispose();
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool setup_bucket()
	{
		base_path += ".";
		base_path += bucket_dirname;

		if (!Path::mkdir(base_path))
		{
			LOGE("Failed to create directory %s.\n", base_path.c_str());
			return false;
		}

		base_path += "/";
		if (!Path::touch(base_path + "TOUCH"))
			LOGW("Failed to touch last access in %s.\n", base_path.c_str());
		base_path += "/" + bucket_basename;

		if (readonly_interface)
			static_cast<StreamArchive &>(*readonly_interface).path = base_path + ".foz";

		return true;
	}